

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O2

void wabt::WriteFloatHex(char *buffer,size_t size,uint32_t bits)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  byte *pbVar7;
  size_t __n;
  char buffer_1 [20];
  
  pcVar6 = buffer_1;
  uVar3 = bits >> 0x17 & 0xff;
  uVar1 = uVar3 - 0x7f;
  if ((int)bits < 0) {
    pcVar6 = buffer_1 + 1;
    buffer_1[0] = '-';
  }
  uVar4 = bits & 0x7fffff;
  if (uVar1 == 0x80) {
    pbVar7 = (byte *)(pcVar6 + 3);
    if (uVar4 == 0) {
      builtin_strncpy(pcVar6,"inf",4);
    }
    else {
      builtin_strncpy(pcVar6,"nan",4);
      if (uVar4 != 0x400000) {
        pbVar7[0] = 0x3a;
        pbVar7[1] = 0x30;
        pbVar7[2] = 0x78;
        pbVar7[3] = 0;
        iVar2 = -8;
        for (; uVar4 < 0x10000000; uVar4 = uVar4 << 4) {
          iVar2 = iVar2 + 1;
        }
        pbVar7 = (byte *)(pcVar6 + 6);
        for (; iVar2 != 0; iVar2 = iVar2 + 1) {
          *pbVar7 = "0123456789abcdef"[uVar4 >> 0x1c];
          pbVar7 = pbVar7 + 1;
          uVar4 = uVar4 << 4;
        }
      }
    }
    goto LAB_0010a1e6;
  }
  pcVar6[0] = '0';
  pcVar6[1] = 'x';
  pcVar6[2] = (uVar3 == 0 && uVar4 == 0) ^ 0x31;
  if (uVar4 == 0) {
    pcVar6 = pcVar6 + 3;
  }
  else {
    uVar5 = uVar4 << 9;
    if (uVar3 == 0) {
      uVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      uVar1 = uVar1 ^ 0x1f;
      uVar5 = uVar5 << ((char)uVar1 + 1U & 0x1f);
      if (uVar1 == 0x1f) {
        uVar5 = 0;
      }
      uVar1 = -uVar1 - 0x7f;
    }
    pcVar6[3] = '.';
    pcVar6 = pcVar6 + 4;
    for (; uVar5 != 0; uVar5 = uVar5 << 4) {
      *pcVar6 = "0123456789abcdef"[uVar5 >> 0x1c];
      pcVar6 = pcVar6 + 1;
    }
  }
  *pcVar6 = 'p';
  if (uVar3 == 0 && uVar4 == 0) {
    pcVar6[3] = '\0';
    pcVar6[1] = '+';
    pcVar6[2] = '0';
    pbVar7 = (byte *)(pcVar6 + 3);
    goto LAB_0010a1e6;
  }
  uVar3 = -uVar1;
  if (0 < (int)uVar1) {
    uVar3 = uVar1;
  }
  pcVar6[1] = (char)((int)uVar1 >> 0x1f) * -2 + '+';
  if (uVar3 < 100) {
    pbVar7 = (byte *)(pcVar6 + 2);
    if (9 < uVar3) goto LAB_0010a1c0;
  }
  else {
    pcVar6[2] = (byte)(((ulong)uVar3 / 100) % 10) | 0x30;
    pbVar7 = (byte *)(pcVar6 + 3);
LAB_0010a1c0:
    *pbVar7 = (byte)(((ulong)uVar3 / 10) % 10) | 0x30;
    pbVar7 = pbVar7 + 1;
  }
  *pbVar7 = (byte)((ulong)uVar3 % 10) | 0x30;
  pbVar7 = pbVar7 + 1;
LAB_0010a1e6:
  __n = size - 1;
  if ((ulong)((long)pbVar7 - (long)buffer_1) < size) {
    __n = (long)pbVar7 - (long)buffer_1;
  }
  memcpy(buffer,buffer_1,__n);
  buffer[__n] = '\0';
  return;
}

Assistant:

void WriteFloatHex(char* buffer, size_t size, uint32_t bits) {
  return FloatWriter<float>::WriteHex(buffer, size, bits);
}